

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

size_t pstore::dump::object::property_length<char>(string *p)

{
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> out;
  object local_1a0 [3];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0[0].compact_);
  property(local_1a0,p);
  (**(code **)(*local_1a0[0].super_value._vptr_value + 0xa8))
            (local_1a0[0].super_value._vptr_value,&local_1a0[0].compact_);
  if (local_1a0[0].members_.
      super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1a0[0].members_.
               super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringbuf::str();
  if ((pointer *)local_1a0[0].super_value._vptr_value !=
      &local_1a0[0].members_.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish) {
    operator_delete(local_1a0[0].super_value._vptr_value,
                    (ulong)((long)&((local_1a0[0].members_.
                                     super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->property).
                                   _M_dataplus._M_p + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0[0].compact_);
  std::ios_base::~ios_base(local_110);
  return (size_t)local_1a0[0].members_.
                 super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
                 ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

std::size_t object::property_length (std::string const & p) {
            std::basic_ostringstream<OStreamCharType> out;
            object::property (p)->write (out);
            return out.str ().length ();
        }